

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.c
# Opt level: O1

Constraint * create_return_value_constraint(intptr_t value_to_return)

{
  Constraint *pCVar1;
  
  pCVar1 = (Constraint *)malloc(0x80);
  pCVar1->destroy = destroy_empty_constraint;
  pCVar1->failure_message = failure_message_for;
  pCVar1->expected_value_name = (char *)0x0;
  pCVar1->parameter_name = (char *)0x0;
  pCVar1->actual_value_message = "\n\t\tactual value:\t\t\t[%ld]";
  pCVar1->expected_value_message = "\t\texpected value:\t\t\t[%ld]";
  pCVar1->type = CGREEN_RETURN_VALUE_CONSTRAINT;
  pCVar1->compare = compare_true;
  pCVar1->execute = test_true;
  pCVar1->name = "return value";
  make_cgreen_integer_value(&pCVar1->expected_value,value_to_return);
  return pCVar1;
}

Assistant:

Constraint *create_return_value_constraint(intptr_t value_to_return) {
    Constraint* constraint = create_constraint();
    constraint->type = CGREEN_RETURN_VALUE_CONSTRAINT;

    constraint->compare = &compare_true;
    constraint->execute = &test_true;
    constraint->name = "return value";
    constraint->expected_value = make_cgreen_integer_value(value_to_return);

    return constraint;
}